

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void sznet::net::defaultConnectionCallback(TcpConnectionPtr *conn)

{
  self *psVar1;
  char *str;
  SourceFile file;
  Logger local_1038;
  undefined1 local_68 [12];
  string local_58;
  string local_38;
  
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<104>
              ((SourceFile *)local_68,
               (char (*) [104])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/TcpConnection.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_68._0_8_;
    file.m_size = local_68._8_4_;
    Logger::Logger(&local_1038,file,0x13,TRACE,"defaultConnectionCallback");
    InetAddress::toIpPort_abi_cxx11_
              (&local_58,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_localAddr);
    psVar1 = LogStream::operator<<(&local_1038.m_impl.m_stream,&local_58);
    psVar1 = LogStream::operator<<(psVar1," -> ");
    InetAddress::toIpPort_abi_cxx11_
              (&local_38,
               &((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->m_peerAddr);
    psVar1 = LogStream::operator<<(psVar1,&local_38);
    psVar1 = LogStream::operator<<(psVar1," is ");
    str = "DOWN";
    if (((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        m_state == kConnected) {
      str = "UP";
    }
    LogStream::operator<<(psVar1,str);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    Logger::~Logger(&local_1038);
  }
  return;
}

Assistant:

void defaultConnectionCallback(const TcpConnectionPtr& conn)
{
	LOG_TRACE << conn->localAddress().toIpPort() << " -> "
		<< conn->peerAddress().toIpPort() << " is "
		<< (conn->connected() ? "UP" : "DOWN");
	// do not call conn->forceClose(), because some users want to register message callback only.
}